

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O2

void test_skiplist_insert_multiple(planck_unit_test_t *tc)

{
  sl_node *psVar1;
  planck_unit_result_t pVar2;
  ion_status_t iVar3;
  int local_94;
  ion_skiplist_t skiplist;
  ion_byte_t strs [5] [6];
  
  initialize_skiplist_std_conditions(&skiplist);
  builtin_memcpy(strs + 2,"three",6);
  builtin_memcpy(strs + 3,"four",5);
  strs[3][5] = '\0';
  builtin_memcpy(strs + 4,"five",5);
  strs[4][5] = '\0';
  builtin_memcpy(strs,"one",4);
  strs[0][4] = '\0';
  strs[0][5] = '\0';
  builtin_memcpy(strs + 1,"two",4);
  strs[1][4] = '\0';
  strs[1][5] = '\0';
  local_94 = 1;
  while( true ) {
    if (5 < local_94) break;
    iVar3 = sl_insert(&skiplist,&local_94,strs + (local_94 + -1));
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(iVar3.error == '\0'),0xe5,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') goto LAB_0010194c;
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(iVar3.count == 1),0xe6,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') goto LAB_0010194c;
    local_94 = local_94 + 1;
  }
  psVar1 = *(skiplist.head)->next;
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(*psVar1->key == 1),0xf0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar2 != '\0') {
    pVar2 = planck_unit_assert_str_are_equal
                      (tc,(char *)psVar1->value,"one",0xf1,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                      );
    if (pVar2 != '\0') {
      psVar1 = *(*(skiplist.head)->next)->next;
      pVar2 = planck_unit_assert_true
                        (tc,(uint)(*psVar1->key == 2),0xf4,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                         ,"condition was false, expected true");
      if (pVar2 != '\0') {
        pVar2 = planck_unit_assert_str_are_equal
                          (tc,(char *)psVar1->value,"two",0xf5,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                          );
        if (pVar2 != '\0') {
          psVar1 = *(*(*(skiplist.head)->next)->next)->next;
          pVar2 = planck_unit_assert_true
                            (tc,(uint)(*psVar1->key == 3),0xf8,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                             ,"condition was false, expected true");
          if (pVar2 != '\0') {
            pVar2 = planck_unit_assert_str_are_equal
                              (tc,(char *)psVar1->value,"three",0xf9,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                              );
            if (pVar2 != '\0') {
              psVar1 = *(*(*(*(skiplist.head)->next)->next)->next)->next;
              pVar2 = planck_unit_assert_true
                                (tc,(uint)(*psVar1->key == 4),0xfc,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                                 ,"condition was false, expected true");
              if (pVar2 != '\0') {
                pVar2 = planck_unit_assert_str_are_equal
                                  (tc,(char *)psVar1->value,"four",0xfd,
                                   "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                                  );
                if (pVar2 != '\0') {
                  psVar1 = *(*(*(*(*(skiplist.head)->next)->next)->next)->next)->next;
                  pVar2 = planck_unit_assert_true
                                    (tc,(uint)(*psVar1->key == 5),0x100,
                                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                                     ,"condition was false, expected true");
                  if (pVar2 != '\0') {
                    pVar2 = planck_unit_assert_str_are_equal
                                      (tc,(char *)psVar1->value,"five",0x101,
                                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                                      );
                    if (pVar2 != '\0') {
                      sl_destroy(&skiplist);
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010194c:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_insert_multiple(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t strs[5][6] = {
		"one", "two", "three", "four", "five"
	};

	int i;

	for (i = 1; i <= 5; i++) {
		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, strs[i - 1]);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	ion_sl_node_t *cursor;

	cursor = skiplist.head->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 1);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "one");

	cursor = skiplist.head->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 2);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "two");

	cursor = skiplist.head->next[0]->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 3);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "three");

	cursor = skiplist.head->next[0]->next[0]->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 4);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "four");

	cursor = skiplist.head->next[0]->next[0]->next[0]->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 5);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "five");

	sl_destroy(&skiplist);
}